

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O2

void reloc_hunk(GlobalVars *gv,FILE *f,LinkedSection *sec,uint32_t relhunk,uint8_t rtype,
               uint16_t rsize)

{
  int *piVar1;
  int iVar2;
  void *pvVar3;
  void *__ptr;
  list *l;
  node *pnVar4;
  node *pnVar5;
  long lVar6;
  uint32_t uVar7;
  node *n;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  ulong local_60;
  
  pnVar4 = (sec->relocs).first;
  pvVar3 = alloc((long)gv->nsecs << 3);
  __ptr = alloczero((long)gv->nsecs << 2);
  for (lVar6 = 0; lVar6 < gv->nsecs; lVar6 = lVar6 + 1) {
    l = (list *)alloc(0x18);
    *(list **)((long)pvVar3 + lVar6 * 8) = l;
    initlist(l);
  }
  if (rsize == 0x18) {
    uVar8 = 6;
    uVar9 = 0x3ffffff;
    local_60 = 0x3fffffc;
  }
  else if (rsize == 0xe) {
    uVar8 = 0x10;
    uVar9 = 0xffff;
    local_60 = 0xfffc;
  }
  else {
    uVar9 = ~(-1L << ((byte)rsize & 0x3f));
    uVar8 = 0;
    local_60 = uVar9;
  }
  bVar10 = true;
  bVar11 = true;
  while (n = pnVar4, pnVar4 = n->next, pnVar4 != (node *)0x0) {
    if ((((*(uint8_t *)&n[3].pred == rtype) && (pnVar5 = n[3].next, pnVar5 != (node *)0x0)) &&
        ((uint)uVar8 == (uint)*(ushort *)&pnVar5->pred)) &&
       ((*(uint16_t *)((long)&pnVar5->pred + 2) == rsize &&
        (((ulong)pnVar5[1].next & uVar9) == local_60)))) {
      remnode(n);
      addtail(*(list **)((long)pvVar3 + (long)*(int *)&n[1].pred[1].next * 8),n);
      pnVar5 = (node *)((long)&(n[2].next)->next + (uVar8 >> 3));
      n[2].next = pnVar5;
      lVar6 = (long)*(int *)&n[1].pred[1].next;
      iVar2 = *(int *)((long)__ptr + lVar6 * 4);
      bVar11 = false;
      if ((node *)0xffff < pnVar5) {
        bVar10 = false;
      }
      *(int *)((long)__ptr + lVar6 * 4) = iVar2 + 1;
      if (0xfffe < iVar2) {
        bVar10 = false;
      }
    }
  }
  if (bVar11) goto LAB_001176cf;
  if (relhunk == 0x3ec) {
    if ((gv->reloctab_format != '\x04') || (!bVar10)) goto LAB_00117651;
    bVar11 = gv->dest_object == 0;
LAB_001175bb:
    uVar7 = 0x3f7;
    if (!bVar11) {
      uVar7 = relhunk;
    }
    if (relhunk != 0x3ec) {
      uVar7 = relhunk;
    }
    fwrite32be(f,uVar7);
    bVar10 = false;
    for (lVar6 = 0; lVar6 < gv->nsecs; lVar6 = lVar6 + 1) {
      iVar2 = *(int *)((long)__ptr + lVar6 * 4);
      if (iVar2 != 0) {
        fwrite16be(f,(uint16_t)iVar2);
        fwrite16be(f,(uint16_t)lVar6);
        while (pnVar4 = remhead(*(list **)((long)pvVar3 + lVar6 * 8)), pnVar4 != (node *)0x0) {
          fwrite16be(f,*(uint16_t *)&pnVar4[2].next);
          bVar10 = (bool)(bVar10 ^ 1);
        }
      }
    }
    if (bVar10) {
      fwrite16be(f,0);
      goto LAB_001176cf;
    }
  }
  else {
    if ((relhunk == 0x3fd) && (gv->dest_object == 0)) {
      bVar11 = true;
      if (!bVar10) {
        for (lVar6 = 0; lVar6 < gv->nsecs; lVar6 = lVar6 + 1) {
          while (pnVar4 = remhead(*(list **)((long)pvVar3 + lVar6 * 8)), pnVar4 != (node *)0x0) {
            addtail(&sec->relocs,pnVar4);
          }
        }
        goto LAB_001176cf;
      }
      goto LAB_001175bb;
    }
LAB_00117651:
    fwrite32be(f,relhunk);
    for (lVar6 = 0; lVar6 < gv->nsecs; lVar6 = lVar6 + 1) {
      while (uVar7 = *(uint32_t *)((long)__ptr + lVar6 * 4), uVar7 != 0) {
        if (0xffff < (int)uVar7) {
          uVar7 = 0x10000;
        }
        fwrite32be(f,uVar7);
        fwrite32be(f,(uint32_t)lVar6);
        piVar1 = (int *)((long)__ptr + lVar6 * 4);
        *piVar1 = *piVar1 - uVar7;
        while (bVar10 = uVar7 != 0, uVar7 = uVar7 - 1, bVar10) {
          pnVar4 = remhead(*(list **)((long)pvVar3 + lVar6 * 8));
          if (pnVar4 != (node *)0x0) {
            fwrite32be(f,*(uint32_t *)&pnVar4[2].next);
          }
        }
      }
    }
  }
  fwrite32be(f,0);
LAB_001176cf:
  for (lVar6 = 0; lVar6 < gv->nsecs; lVar6 = lVar6 + 1) {
    free(*(void **)((long)pvVar3 + lVar6 * 8));
  }
  free(__ptr);
  return;
}

Assistant:

static void reloc_hunk(struct GlobalVars *gv,FILE *f,
                       struct LinkedSection *sec,uint32_t relhunk,
                       uint8_t rtype,uint16_t rsize)
/* generate an AmigaDOS/EHF relocation hunk for a specific reloc type */
{
  struct Reloc *nextrel,*rel=(struct Reloc *)sec->relocs.first;
  struct list **rlist=alloc(gv->nsecs*sizeof(struct list *));
  int *rcnt=alloczero(gv->nsecs*sizeof(int)); /* reloc cnt for all sect. */
  bool hunk_required=FALSE,small_offsets=TRUE;
  lword chkmask,rmask=makemask(rsize);
  uint16_t rpos=0;
  int i;

  for (i=0; i<gv->nsecs; i++) {  /* empty reloc lists for each section */
    rlist[i] = alloc(sizeof(struct list));
    initlist(rlist[i]);
  }

  /* EHF-PowerPC relocations need special treatment */
  if (rsize == 24) {
    rpos = 6;
    rmask = 0x3ffffff;
    chkmask = 0x3fffffc;
  }
  else if (rsize == 14) {
    rpos = 16;
    rmask = 0xffff;
    chkmask = 0xfffc;
  }
  else
    chkmask = rmask;

  while (nextrel = (struct Reloc *)rel->n.next) {
    struct RelocInsert *ri;
    int newrcnt;

    if (rel->rtype==rtype && (ri=rel->insert)!=NULL) {
      if (ri->bpos==rpos && ri->bsiz==rsize && (ri->mask&rmask)==chkmask) {
        /* move reloc node of correct type into relocssect's rlist */
        remnode(&rel->n);
        addtail(rlist[rel->relocsect.lnk->index],&rel->n);
        rel->offset += rpos >> 3;
        if (++rcnt[rel->relocsect.lnk->index] >= 0x10000 ||
            rel->offset >= 0x10000)
          small_offsets = FALSE; /* no short-reloc hunk would be possible */
        hunk_required = TRUE;
      }
    }
    rel = nextrel;
  }

  if (hunk_required) {  /* there's at least one relocation */

    if ((relhunk==HUNK_ABSRELOC32 &&
         gv->reloctab_format==RTAB_SHORTOFF && small_offsets) ||
        (relhunk==HUNK_RELRELOC32 && !gv->dest_object)) {
      /* Make a short hunk with 16-bit offsets.
         For executables, HUNK_DREL32 is used instead of the correct
         HUNK_RELOC32SHORT to be compatible with OS2.0.
         Due to a bug in OS3.x HUNK_RELRELOC32 requires 16-bit offsets
         in executables. */
      int cnt=0;

      if (!small_offsets) {
        /* cannot represent those relocs, so put them back */
        for (i=0; i<gv->nsecs; i++) {
          while (rel = (struct Reloc *)remhead(rlist[i]))
            addtail(&sec->relocs,&rel->n);
        }
        goto free_rlists;
      }
      if (!gv->dest_object && relhunk==HUNK_ABSRELOC32)
        relhunk = HUNK_DREL32;
      fwrite32be(f,relhunk);  /* reloc hunk id */

      for (i=0; i<gv->nsecs; i++) {
        if (rcnt[i]) {
          fwrite16be(f,(uint16_t)rcnt[i]);  /* number of relocations */
          fwrite16be(f,(uint16_t)i);  /* section index */
          cnt += 2;

          /* store relocation offsets */
          while (rel = (struct Reloc *)remhead(rlist[i])) {
            fwrite16be(f,(uint16_t)rel->offset);
            cnt++;
          }
        }
      }
      /* no more relocation entries */
      if (cnt & 1)  /* 0-word for 32-bit alignment */
        fwrite16be(f,0);
      else
        fwrite32be(f,0);
    }

    else {
      /* all other relocation hunks */
      fwrite32be(f,relhunk);  /* reloc hunk id */
      for (i=0; i<gv->nsecs; i++) {
        while (rcnt[i]) {
          /* never write more than 65536 relocs at once - there is a bug */
          /* in dos.library which rejects the executable file otherwise */
          int n = (rcnt[i]>0x10000) ? 0x10000 : rcnt[i];

          fwrite32be(f,(uint32_t)n);  /* number of relocations */
          fwrite32be(f,(uint32_t)i);  /* section index */
          rcnt[i] -= n;

          /* store relocation offsets */
          while (n--) {
            if (rel = (struct Reloc *)remhead(rlist[i])) {
              fwrite32be(f,(uint32_t)rel->offset);
            }
          }
        }
      }
      fwrite32be(f,0);  /* no more relocation entries */
    }
  }

  free_rlists:
  /* free dynamically allocated rlists and rcnt array */
  for (i=0; i<gv->nsecs; free(rlist[i++]));
  free(rcnt);
}